

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Resize(TPZSkylMatrix<double> *this,int64_t newDim,int64_t param_3)

{
  double *pdVar1;
  TPZVec<double> *pTVar2;
  long lVar3;
  double **ppdVar4;
  TPZVec<double> *in_RSI;
  long *in_RDI;
  int64_t i;
  int64_t min;
  TPZVec<double> *newsize;
  TPZVec<double_*> *in_stack_ffffffffffffffd0;
  TPZVec<double> *this_00;
  
  newsize = in_RSI;
  pTVar2 = (TPZVec<double> *)(**(code **)(*in_RDI + 0x60))();
  if (newsize != pTVar2) {
    TPZVec<double_*>::Resize(in_stack_ffffffffffffffd0,(int64_t)newsize);
    lVar3 = (**(code **)(*in_RDI + 0x60))();
    pTVar2 = in_RSI;
    if (lVar3 <= (long)in_RSI) {
      pTVar2 = (TPZVec<double> *)(**(code **)(*in_RDI + 0x60))();
    }
    while (this_00 = (TPZVec<double> *)((long)&pTVar2->_vptr_TPZVec + 1),
          (long)this_00 <= (long)in_RSI) {
      ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),(int64_t)pTVar2);
      pdVar1 = *ppdVar4;
      ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),(int64_t)this_00);
      *ppdVar4 = pdVar1;
      pTVar2 = this_00;
    }
    TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),(int64_t)in_RSI);
    TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),0);
    TPZVec<double>::Resize(this_00,(int64_t)newsize);
    in_RDI[2] = (long)in_RSI;
    in_RDI[1] = (long)in_RSI;
    *(undefined1 *)(in_RDI + 3) = 0;
  }
  return 1;
}

Assistant:

int TPZSkylMatrix<TVar>::Resize( int64_t newDim ,int64_t ) {
	if ( newDim == this->Dim() )
		return( 1 );
	
	fElem.Resize(newDim+1);
	// Cria nova matrix.
	
	// Copia os elementos para a nova matriz.
	int64_t min = MIN( newDim, this->Dim() );
	int64_t i;
	for ( i = min+1; i <= newDim; i++ )
		fElem[i] = fElem[i-1];
	
	// Zera as posicoes que sobrarem (se sobrarem)
	fStorage.Resize(fElem[newDim]-fElem[0]);
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}